

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,FuncDestructor *pDestructor)

{
  char *pcVar1;
  int iVar2;
  FuncDef *pFVar3;
  Vdbe *pVVar4;
  uint nName;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  if (zFunctionName != (char *)0x0) {
    bVar6 = xFinal != (_func_void_sqlite3_context_ptr *)0x0;
    if (xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      bVar7 = xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
      if (xFinal != (_func_void_sqlite3_context_ptr *)0x0 && !bVar7) goto LAB_00126e56;
    }
    else {
      if (xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
          xFinal != (_func_void_sqlite3_context_ptr *)0x0) goto LAB_00126e56;
      bVar7 = false;
      bVar6 = false;
    }
    if ((0xffffff7e < nArg - 0x80U) &&
       (!(bool)(bVar7 & xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &
               (bVar6 ^ 1U)))) {
      lVar5 = 0;
      do {
        pcVar1 = zFunctionName + lVar5;
        lVar5 = lVar5 + 1;
      } while (*pcVar1 != '\0');
      nName = (int)lVar5 - 1U & 0x3fffffff;
      if (nName < 0x100) {
        if (enc == 4) {
          enc = 2;
        }
        else if (enc == 5) {
          iVar2 = sqlite3CreateFunc(db,zFunctionName,nArg,1,pUserData,xFunc,xStep,xFinal,pDestructor
                                   );
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = sqlite3CreateFunc(db,zFunctionName,nArg,2,pUserData,xFunc,xStep,xFinal,pDestructor
                                   );
          if (iVar2 != 0) {
            return iVar2;
          }
          enc = 3;
        }
        pFVar3 = sqlite3FindFunction(db,zFunctionName,nName,nArg,(u8)enc,'\0');
        if (((pFVar3 != (FuncDef *)0x0) && (enc == (uint)pFVar3->iPrefEnc)) &&
           (pFVar3->nArg == nArg)) {
          if (db->activeVdbeCnt != 0) {
            sqlite3Error(db,5,"unable to delete/modify user-function due to active statements");
            return 5;
          }
          for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pNext) {
            pVVar4->field_0x9a = pVVar4->field_0x9a | 0x20;
          }
        }
        pFVar3 = sqlite3FindFunction(db,zFunctionName,nName,nArg,(u8)enc,'\x01');
        if (pFVar3 != (FuncDef *)0x0) {
          functionDestroy(db,(FuncDef *)pFVar3->pDestructor);
          if (pDestructor != (FuncDestructor *)0x0) {
            pDestructor->nRef = pDestructor->nRef + 1;
          }
          pFVar3->pDestructor = pDestructor;
          pFVar3->flags = '\0';
          pFVar3->xFunc = xFunc;
          pFVar3->xStep = xStep;
          pFVar3->xFinalize = xFinal;
          pFVar3->pUserData = pUserData;
          pFVar3->nArg = (i16)nArg;
          return 0;
        }
        return 7;
      }
    }
  }
LAB_00126e56:
  sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x1c5ae,"118a3b35693b134d56ebd780123b7fd6f1497668"
             );
  return 0x15;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int nName;

  assert( sqlite3_mutex_held(db->mutex) );
  if( zFunctionName==0 ||
      (xFunc && (xFinal || xStep)) || 
      (!xFunc && (xFinal && !xStep)) ||
      (!xFunc && (!xFinal && xStep)) ||
      (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG) ||
      (255<(nName = sqlite3Strlen30( zFunctionName))) ){
    return SQLITE_MISUSE_BKPT;
  }
  
#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  if( enc==SQLITE_UTF16 ){
    enc = SQLITE_UTF16NATIVE;
  }else if( enc==SQLITE_ANY ){
    int rc;
    rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF8,
         pUserData, xFunc, xStep, xFinal, pDestructor);
    if( rc==SQLITE_OK ){
      rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF16LE,
          pUserData, xFunc, xStep, xFinal, pDestructor);
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    enc = SQLITE_UTF16BE;
  }
#else
  enc = SQLITE_UTF8;
#endif
  
  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 0);
  if( p && p->iPrefEnc==enc && p->nArg==nArg ){
    if( db->activeVdbeCnt ){
      sqlite3Error(db, SQLITE_BUSY, 
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db);
    }
  }

  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->pDestructor = pDestructor;
  p->flags = 0;
  p->xFunc = xFunc;
  p->xStep = xStep;
  p->xFinalize = xFinal;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}